

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::SetI2P(CNetAddr *this,string *addr)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> address_bytes;
  string b32_padded;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (addr->_M_string_length == 0x3c) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&address_bytes,
               addr,0x34,0xffffffffffffffff);
    str._M_str = (char *)address_bytes.
                         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ._M_payload._M_value.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    str._M_len = (size_t)address_bytes.
                         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ._M_payload._M_value.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    ToLower_abi_cxx11_(&b32_padded,str);
    bVar2 = std::operator==(&b32_padded,".b32.i2p");
    std::__cxx11::string::~string((string *)&b32_padded);
    std::__cxx11::string::~string((string *)&address_bytes);
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&address_bytes
                 ,addr,0,0x34);
      std::operator+(&b32_padded,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &address_bytes,"====");
      std::__cxx11::string::~string((string *)&address_bytes);
      str_00._M_str = b32_padded._M_dataplus._M_p;
      str_00._M_len = b32_padded._M_string_length;
      DecodeBase32(&address_bytes,str_00);
      if (address_bytes.
          super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ._M_engaged == true) {
        if ((long)address_bytes.
                  super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            address_bytes.
            super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ._M_payload._0_8_ != 0x20) goto LAB_00a82d19;
        this->m_net = NET_I2P;
        bVar2 = true;
        prevector<16U,_unsigned_char,_unsigned_int,_int>::
        assign<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  (&this->m_addr,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )address_bytes.
                     super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ._M_payload._M_value.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )address_bytes.
                     super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ._M_payload._M_value.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
      }
      else {
LAB_00a82d19:
        bVar2 = false;
      }
      std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      _M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&address_bytes);
      std::__cxx11::string::~string((string *)&b32_padded);
      goto LAB_00a82d2d;
    }
  }
  bVar2 = false;
LAB_00a82d2d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::SetI2P(const std::string& addr)
{
    // I2P addresses that we support consist of 52 base32 characters + ".b32.i2p".
    static constexpr size_t b32_len{52};
    static const char* suffix{".b32.i2p"};
    static constexpr size_t suffix_len{8};

    if (addr.size() != b32_len + suffix_len || ToLower(addr.substr(b32_len)) != suffix) {
        return false;
    }

    // Remove the ".b32.i2p" suffix and pad to a multiple of 8 chars, so DecodeBase32()
    // can decode it.
    const std::string b32_padded = addr.substr(0, b32_len) + "====";

    auto address_bytes = DecodeBase32(b32_padded);

    if (!address_bytes || address_bytes->size() != ADDR_I2P_SIZE) {
        return false;
    }

    m_net = NET_I2P;
    m_addr.assign(address_bytes->begin(), address_bytes->end());

    return true;
}